

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playera.cpp
# Opt level: O0

void SampleConv_toU8(void *buffer,INT32 value)

{
  undefined4 local_14;
  INT32 value_local;
  void *buffer_local;
  
  local_14 = value >> 0x10;
  if (local_14 < -0x80) {
    local_14._0_1_ = -0x80;
  }
  else {
    if (0x7f < local_14) {
      local_14 = 0x7f;
    }
  }
  *(char *)buffer = (char)local_14 + -0x80;
  return;
}

Assistant:

static void SampleConv_toU8(void* buffer, INT32 value)
{
	value >>= 16;	// 24 bit -> 8 bit
	if (value < -0x80)
		value = -0x80;
	else if (value > +0x7F)
		value = +0x7F;
	*(UINT8*)buffer = (UINT8)(0x80 + value);
	return;
}